

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O3

int __thiscall qclab::qgates::SWAP<double>::toQASM(SWAP<double> *this,ostream *stream,int offset)

{
  int in_R8D;
  __string_type local_30;
  
  qasm2_abi_cxx11_(&local_30,(qclab *)"swap",
                   (char *)(ulong)(uint)((this->qubits_)._M_elems[0] + offset),
                   offset + (this->qubits_)._M_elems[1],in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmSWAP( qubits_[0] + offset , qubits_[1] + offset ) ;
          return 0 ;
        }